

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall
Am_Slot_Data::Am_Slot_Data
          (Am_Slot_Data *this,Am_Object_Data *object,Am_Slot_Key in_key,Am_Value_Type in_type)

{
  ushort uVar1;
  unsigned_short uVar2;
  ushort uVar3;
  
  (this->super_Am_Value).type = 0;
  (this->super_Am_Value).value.wrapper_value = (Am_Wrapper *)0x0;
  this->context = object;
  am_CList::am_CList(&this->constraints);
  am_CList::am_CList(&this->dependencies);
  am_CList::am_CList(&this->invalid_constraints);
  this->key = in_key;
  if (object == (Am_Object_Data *)0x0) {
    uVar1 = (ushort)(byte)this->field_0x39 << 8;
    *(ushort *)&this->field_0x38 = uVar1;
    uVar2 = 0;
    uVar3 = 0;
  }
  else {
    uVar2 = object->default_bits;
    uVar1 = (ushort)(byte)this->field_0x39 << 8;
    *(ushort *)&this->field_0x38 = uVar1;
    uVar3 = (ushort)((object->default_rule & Am_STATIC) << 8);
  }
  this->enabled_demons = uVar2;
  this->queued_demons = 0;
  this->type_check = 0;
  *(ushort *)&this->field_0x38 = uVar3 | uVar1 & 0xfc00;
  (this->super_Am_Value).value.wrapper_value = (Am_Wrapper *)0x0;
  (this->super_Am_Value).type = in_type;
  return;
}

Assistant:

Am_Slot_Data::Am_Slot_Data(Am_Object_Data *object, Am_Slot_Key in_key,
                           Am_Value_Type in_type)
    : context(object), key(in_key), flags(0),
      enabled_demons(object ? object->default_bits : 0),
      rule(object ? object->default_rule : Am_LOCAL), queued_demons(0),
      type_check(0)
{
  value.voidptr_value = nullptr;
  type = in_type;
}